

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

string * __thiscall helics::Input::getPublicationType_abi_cxx11_(Input *this)

{
  Interface *in_RDI;
  DataType in_stack_0000006c;
  string *local_18;
  
  if ((*(int *)((long)&in_RDI[1].mName._M_dataplus._M_p + 4) == -1) ||
     (*(int *)((long)&in_RDI[1].mName._M_dataplus._M_p + 4) == 0x19)) {
    local_18 = Interface::getInjectionType_abi_cxx11_(in_RDI);
  }
  else {
    local_18 = typeNameStringRef_abi_cxx11_(in_stack_0000006c);
  }
  return local_18;
}

Assistant:

const std::string& getPublicationType() const
    {
        return ((injectionType == DataType::HELICS_UNKNOWN) ||
                (injectionType == DataType::HELICS_CUSTOM)) ?
            getInjectionType() :
            typeNameStringRef(injectionType);
    }